

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O2

ssize_t chatter::platform::SocketSendTo(Socket socket,void *buf,size_t buf_len,HostAddress *address)

{
  uint16_t uVar1;
  ssize_t sVar2;
  sockaddr local_38;
  
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  local_38.sa_family = 2;
  uVar1 = HostAddress::port(address);
  local_38.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  local_38.sa_data._2_4_ = HostAddress::address(address);
  sVar2 = sendto(socket,buf,buf_len,0,&local_38,0x10);
  return sVar2;
}

Assistant:

ssize_t SocketSendTo(Socket socket, const void *buf, size_t buf_len, const HostAddress& address)
{
    struct sockaddr_in dest = {0};
    dest.sin_family = AF_INET;
    dest.sin_port = HostToNet16(address.port());
    dest.sin_addr.s_addr = address.address();
    return sendto((int)socket, buf, buf_len, 0, (struct sockaddr*)&dest, sizeof(dest));
}